

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C,DefSite *ds)

{
  pointer pRVar1;
  bool bVar2;
  RWNode *pRVar3;
  RWCalledValue *callee;
  pointer pRVar4;
  pointer this_00;
  DefSite uncoveredds;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  
  bVar2 = callMayDefineTarget(this,C,ds->target);
  if (bVar2) {
    DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&uncovered,&D->kills,ds);
    for (this_00 = uncovered.
                   super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        uncovered.
        super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      pRVar3 = ds->target;
      uncoveredds.len = ADT::DiscreteInterval<dg::Offset>::length(this_00);
      uncoveredds.offset.offset = (this_00->start).offset;
      uncoveredds.target = pRVar3;
      pRVar3 = createPhi(this,D,&uncoveredds,CALLOUT);
      BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
                (&((C->super_RWNode).bblock)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>,
                 pRVar3);
      RWNodeCall::addOutput(C,pRVar3);
      pRVar1 = (C->callees).
               super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pRVar4 = (C->callees).
                    super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1
          ) {
        if (pRVar4->subgraph == (RWSubgraph *)0x0) {
          addDefinitionsFromCalledValue(this,pRVar3,C,&uncoveredds,pRVar4->calledValue);
        }
        else {
          findDefinitionsInSubgraph(this,pRVar3,C,&uncoveredds,pRVar4->subgraph);
        }
      }
    }
    std::
    _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::~_Vector_base(&uncovered.
                     super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                   );
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C,
                                                      const DefSite &ds) {
    if (!callMayDefineTarget(C, ds.target))
        return;

    // find the uncovered parts of the sought definition
    auto uncovered = D.uncovered(ds);
    for (auto &interval : uncovered) {
        auto uncoveredds =
                DefSite{ds.target, interval.start, interval.length()};
        // this phi will merge the definitions from all the
        // possibly called subgraphs
        auto *phi = createPhi(D, uncoveredds, RWNodeType::CALLOUT);
        C->getBBlock()->append(phi);
        C->addOutput(phi);

        // recursively find definitions for this phi node
        for (auto &callee : C->getCallees()) {
            if (auto *subg = callee.getSubgraph()) {
                findDefinitionsInSubgraph(phi, C, uncoveredds, subg);
            } else {
                addDefinitionsFromCalledValue(phi, C, uncoveredds,
                                              callee.getCalledValue());
            }
        }
    }
}